

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void av1_enc_build_inter_predictor_y_nonrd
               (MACROBLOCKD *xd,InterPredParams *inter_pred_params,SubpelParams *subpel_params)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined6 uVar3;
  int iVar4;
  int iVar5;
  int src_stride;
  int dst_stride;
  MB_MODE_INFO *pMVar6;
  uint8_t *puVar7;
  uint8_t *dst;
  uint8_t *puVar8;
  uint3 uVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [11];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  undefined1 auVar18 [12];
  undefined1 auVar21 [16];
  undefined1 auVar19 [13];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar23 [16];
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  
  pMVar6 = *xd->mi;
  iVar4 = subpel_params->pos_x;
  iVar5 = subpel_params->pos_y;
  src_stride = xd->plane[0].pre[0].stride;
  puVar7 = xd->plane[0].pre[0].buf0;
  dst = xd->plane[0].dst.buf;
  dst_stride = xd->plane[0].dst.stride;
  iVar10 = xd->plane[0].pre[0].height;
  iVar11 = xd->plane[0].pre[0].stride;
  uVar12 = *(undefined4 *)&xd->plane[0].pre[0].field_0x1c;
  (inter_pred_params->ref_frame_buf).width = xd->plane[0].pre[0].width;
  (inter_pred_params->ref_frame_buf).height = iVar10;
  (inter_pred_params->ref_frame_buf).stride = iVar11;
  *(undefined4 *)&(inter_pred_params->ref_frame_buf).field_0x1c = uVar12;
  puVar8 = xd->plane[0].pre[0].buf0;
  (inter_pred_params->ref_frame_buf).buf = xd->plane[0].pre[0].buf;
  (inter_pred_params->ref_frame_buf).buf0 = puVar8;
  auVar13 = ZEXT416((pMVar6->interp_filters).as_int) & _DAT_004ca0f0;
  uVar1 = xd->plane[0].width;
  uVar2 = xd->plane[0].height;
  uVar3 = *(undefined6 *)&xd->plane[0].field_0xaa;
  cVar27 = (char)uVar3;
  cVar28 = (char)((uint6)uVar3 >> 8);
  cVar29 = (char)((uint6)uVar3 >> 0x10);
  cVar30 = (char)((uint6)uVar3 >> 0x18);
  cVar31 = (char)((uint6)uVar3 >> 0x20);
  cVar32 = (char)((uint6)uVar3 >> 0x28);
  auVar20[0] = -((char)((5 < (byte)uVar1) * uVar1 | (5 >= (byte)uVar1) * '\x05') == uVar1);
  cVar26 = -((char)((5 < (byte)uVar2) * uVar2 | (5 >= (byte)uVar2) * '\x05') == uVar2);
  cVar27 = -((char)((cVar27 != '\0') * cVar27) == cVar27);
  cVar28 = -((char)((cVar28 != '\0') * cVar28) == cVar28);
  cVar29 = -((char)((cVar29 != '\0') * cVar29) == cVar29);
  cVar30 = -((char)((cVar30 != '\0') * cVar30) == cVar30);
  cVar31 = -((char)((cVar31 != '\0') * cVar31) == cVar31);
  cVar32 = -((char)((cVar32 != '\0') * cVar32) == cVar32);
  uVar9 = CONCAT12(0xff,CONCAT11(0xff,cVar32));
  auVar17._0_10_ = (unkuint10)uVar9 << 0x38;
  auVar17[10] = 0xff;
  auVar18[0xb] = 0xff;
  auVar18._0_11_ = auVar17;
  auVar19[0xc] = 0xff;
  auVar19._0_12_ = auVar18;
  auVar24[0xd] = 0xff;
  auVar24._0_13_ = auVar19;
  auVar24[0xe] = cVar32;
  auVar24[0xf] = cVar32;
  auVar23._14_2_ = auVar24._14_2_;
  auVar23[0xd] = cVar31;
  auVar23._0_13_ = auVar19;
  auVar22._13_3_ = auVar23._13_3_;
  auVar22[0xc] = cVar31;
  auVar22._0_12_ = auVar18;
  auVar21._12_4_ = auVar22._12_4_;
  auVar21[0xb] = cVar30;
  auVar21._0_11_ = auVar17;
  auVar20._8_8_ =
       (undefined8)
       (CONCAT72((int7)(CONCAT63((int6)(CONCAT54(auVar21._11_5_,CONCAT13(cVar30,uVar9)) >> 0x18),
                                 CONCAT12(cVar29,CONCAT11(0xff,cVar32))) >> 0x10),
                 CONCAT11(cVar29,cVar32)) >> 8);
  auVar20[7] = cVar28;
  auVar20[6] = cVar28;
  auVar20[5] = cVar27;
  auVar20[4] = cVar27;
  auVar20[3] = cVar26;
  auVar20[2] = cVar26;
  auVar20[1] = auVar20[0];
  auVar14._8_4_ = 0xffffffff;
  auVar14._0_8_ = 0xffffffffffffffff;
  auVar14._12_4_ = 0xffffffff;
  auVar14 = pshuflw(auVar14 ^ auVar20,auVar14 ^ auVar20,0x50);
  auVar15._0_4_ = auVar14._0_4_;
  auVar15._4_4_ = auVar15._0_4_;
  auVar15._8_4_ = auVar14._4_4_;
  auVar15._12_4_ = auVar14._4_4_;
  auVar14 = pshuflw(auVar20,auVar13,0x50);
  auVar25._0_2_ = -(ushort)(auVar14._4_2_ == 4);
  auVar25._2_2_ = -(ushort)(auVar14._6_2_ == 4);
  auVar25._4_2_ = -(ushort)(auVar14._4_2_ == 4);
  auVar25._6_2_ = -(ushort)(auVar14._6_2_ == 4);
  auVar25._8_2_ = -(ushort)(auVar14._0_2_ == 4);
  auVar25._10_2_ = -(ushort)(auVar14._2_2_ == 4);
  auVar25._12_2_ = -(ushort)(auVar14._0_2_ == 4);
  auVar25._14_2_ = -(ushort)(auVar14._2_2_ == 4);
  auVar16._8_8_ = av1_interp_4tap + auVar13._0_2_;
  auVar16._0_8_ = av1_interp_4tap + auVar13._2_2_;
  auVar33._8_8_ = av1_interp_filter_params_list + auVar13._0_2_;
  auVar33._0_8_ = av1_interp_filter_params_list + auVar13._2_2_;
  *(undefined1 (*) [16])inter_pred_params->interp_filter_params =
       ~(~auVar25 & auVar15) & auVar33 | auVar16 & ~auVar25 & auVar15;
  av1_make_inter_predictor
            (puVar7 + (long)(iVar4 >> 10) + (long)((iVar5 >> 10) * src_stride),src_stride,dst,
             dst_stride,inter_pred_params,subpel_params);
  return;
}

Assistant:

void av1_enc_build_inter_predictor_y_nonrd(MACROBLOCKD *xd,
                                           InterPredParams *inter_pred_params,
                                           const SubpelParams *subpel_params) {
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];

  const MB_MODE_INFO *mbmi = xd->mi[0];
  struct buf_2d *const dst_buf = &pd->dst;
  const struct buf_2d *pre_buf = &pd->pre[0];
  const uint8_t *src =
      pre_buf->buf0 +
      (subpel_params->pos_y >> SCALE_SUBPEL_BITS) * pre_buf->stride +
      (subpel_params->pos_x >> SCALE_SUBPEL_BITS);
  uint8_t *const dst = dst_buf->buf;
  int src_stride = pre_buf->stride;
  int dst_stride = dst_buf->stride;
  inter_pred_params->ref_frame_buf = *pre_buf;

  // Initialize interp filter for single reference mode.
  init_interp_filter_params(inter_pred_params->interp_filter_params,
                            &mbmi->interp_filters.as_filters, pd->width,
                            pd->height, /*is_intrabc=*/0);

  av1_make_inter_predictor(src, src_stride, dst, dst_stride, inter_pred_params,
                           subpel_params);
}